

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EqualToTests.cpp
# Opt level: O1

void __thiscall IsNotEqualToIterableTests::Run(IsNotEqualToIterableTests *this)

{
  undefined8 local_118;
  undefined8 uStack_110;
  code *local_108;
  code *local_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  code *local_e8;
  code *local_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  code *local_c8;
  code *local_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  code *local_a8;
  code *local_a0;
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  undefined1 *local_58 [2];
  undefined1 local_48 [16];
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_38,"Is::Not::EqualTo equal iterables fails","");
  local_b8 = 0;
  uStack_b0 = 0;
  local_a0 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Unit/Is/EqualToTests.cpp:82:50)>
             ::_M_invoke;
  local_a8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Unit/Is/EqualToTests.cpp:82:50)>
             ::_M_manager;
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[6])
            (this,(string *)local_38);
  if (local_a8 != (code *)0x0) {
    (*local_a8)(&local_b8,&local_b8,3);
  }
  if (local_38[0] != local_28) {
    operator_delete(local_38[0]);
  }
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,"Is::Not::EqualTo not equal iterable succeeds","");
  local_d8 = 0;
  uStack_d0 = 0;
  local_c0 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Unit/Is/EqualToTests.cpp:86:56)>
             ::_M_invoke;
  local_c8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Unit/Is/EqualToTests.cpp:86:56)>
             ::_M_manager;
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[6])
            (this,(string *)local_58);
  if (local_c8 != (code *)0x0) {
    (*local_c8)(&local_d8,&local_d8,3);
  }
  if (local_58[0] != local_48) {
    operator_delete(local_58[0]);
  }
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,"Is::Not::EqualTo iterable is an operand","");
  local_f8 = 0;
  uStack_f0 = 0;
  local_e0 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Unit/Is/EqualToTests.cpp:90:51)>
             ::_M_invoke;
  local_e8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Unit/Is/EqualToTests.cpp:90:51)>
             ::_M_manager;
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[6])
            (this,(string *)local_78);
  if (local_e8 != (code *)0x0) {
    (*local_e8)(&local_f8,&local_f8,3);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0]);
  }
  local_98[0] = local_88;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_98,"Is::Not::EqualTo not equal iterable has an error message","");
  local_118 = 0;
  uStack_110 = 0;
  local_100 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Unit/Is/EqualToTests.cpp:94:68)>
              ::_M_invoke;
  local_108 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Unit/Is/EqualToTests.cpp:94:68)>
              ::_M_manager;
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[6])
            (this,(string *)local_98);
  if (local_108 != (code *)0x0) {
    (*local_108)(&local_118,&local_118,3);
  }
  if (local_98[0] != local_88) {
    operator_delete(local_98[0]);
  }
  return;
}

Assistant:

virtual void Run()
	{
		Then("Is::Not::EqualTo equal iterables fails", []() {
			AssertThat(ut11::Is::Not::EqualTo(std::vector<int>({ 1, 2, 3 }))(std::vector<int>({ 1, 2, 3 })), ut11::Is::Not::True);
		});

		Then("Is::Not::EqualTo not equal iterable succeeds", []() {
			AssertThat(ut11::Is::Not::EqualTo(std::vector<int>({ 1, 2, 7 }))(std::vector<int>({ 1, 2, 15 })), ut11::Is::True);
		});

		Then("Is::Not::EqualTo iterable is an operand", []() {
			AssertThat(ut11::detail::IsOperand< decltype(ut11::Is::Not::EqualTo(std::vector<int>({ 1, 2, 3 }))) >::value, ut11::Is::True);
		});

		Then("Is::Not::EqualTo not equal iterable has an error message", []() {
			AssertThat(ut11::Is::Not::EqualTo(std::vector<int>({ 1, 2, 3 })).GetErrorMessage(std::vector<int>({ 3, 2, 1 })), ut11::Is::Not::EqualTo(""));
		});
	}